

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _d;
  int _elempack;
  _func_int *p_Var1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  void *pvVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  ulong uVar24;
  uint uVar25;
  undefined1 (*pauVar26) [16];
  uint uVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  p_Var1 = this->_vptr_Cast_x86_fma[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var1) == *(int *)(&this->field_0xd4 + (long)p_Var1)) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar13 = bottom_blob->w;
      iVar14 = bottom_blob->h;
      iVar23 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar13;
      top_blob->h = iVar14;
      top_blob->d = iVar23;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar13 = 0;
    }
  }
  else {
    iVar14 = bottom_blob->w;
    iVar23 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar17 = bottom_blob->c;
    iVar13 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar18 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var1)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var1) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_fma + (long)p_Var1),bottom_blob,top_blob,
                      opt);
      }
      sVar18 = sVar18 * 4;
      break;
    case 2:
    case 4:
      sVar18 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar18 = bottom_blob->elemsize;
    }
    switch(iVar13) {
    case 1:
      Mat::create(top_blob,iVar14,sVar18,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar14,iVar23,sVar18,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar14,iVar23,uVar17,sVar18,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar14,iVar23,_d,uVar17,sVar18,_elempack,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 1) &&
         ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 2 &&
          (iVar13 = bottom_blob->c, 0 < (long)iVar13)))) {
        uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar29 = (undefined1 (*) [32])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar26 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar27 < 8) {
            uVar25 = 0;
          }
          else {
            iVar12 = 7;
            do {
              auVar31 = vcvtps2ph_f16c(*pauVar29,8);
              *pauVar26 = auVar31;
              pauVar29 = pauVar29 + 1;
              pauVar26 = pauVar26 + 1;
              iVar12 = iVar12 + 8;
              uVar25 = uVar27 & 0xfffffff8;
            } while (iVar12 < (int)uVar27);
          }
          uVar16 = uVar25 | 3;
          while ((int)uVar16 < (int)uVar27) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar29,8);
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
            uVar16 = uVar25 + 7;
            uVar25 = uVar25 + 4;
          }
          if (uVar27 - uVar25 != 0 && (int)uVar25 <= (int)uVar27) {
            lVar28 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              uVar11 = float32_to_float16(*(float *)(*pauVar29 + lVar28 * 4));
              *(unsigned_short *)(*pauVar26 + lVar28 * 2) = uVar11;
              lVar28 = lVar28 + 1;
            } while (uVar27 - uVar25 != (int)lVar28);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar13);
      }
      auVar31 = in_ZMM3._0_16_;
      if (((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 2) &&
          (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1)) &&
         (iVar13 = bottom_blob->c, 0 < (long)iVar13)) {
        uVar27 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        do {
          pauVar26 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar29 = (undefined1 (*) [32])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar27 < 8) {
            uVar25 = 0;
          }
          else {
            iVar12 = 7;
            do {
              auVar8 = vcvtph2ps_f16c(*pauVar26);
              *pauVar29 = auVar8;
              pauVar26 = pauVar26 + 1;
              pauVar29 = pauVar29 + 1;
              iVar12 = iVar12 + 8;
              uVar25 = uVar27 & 0xfffffff8;
            } while (iVar12 < (int)uVar27);
          }
          uVar16 = uVar25 | 3;
          while ((int)uVar16 < (int)uVar27) {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)*pauVar26;
            auVar31 = vcvtph2ps_f16c(auVar31);
            *(undefined1 (*) [16])*pauVar29 = auVar31;
            pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar16 = uVar25 + 7;
            uVar25 = uVar25 + 4;
          }
          if (uVar27 - uVar25 != 0 && (int)uVar25 <= (int)uVar27) {
            lVar28 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              fVar30 = float16_to_float32(*(unsigned_short *)(*pauVar26 + lVar28 * 2));
              *(float *)(*pauVar29 + lVar28 * 4) = fVar30;
              lVar28 = lVar28 + 1;
            } while (uVar27 - uVar25 != (int)lVar28);
          }
          auVar31 = in_ZMM3._0_16_;
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar13);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 3) &&
         (0 < (int)uVar17 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1))
      {
        uVar27 = _d * _elempack * iVar23 * iVar14;
        pvVar15 = bottom_blob->data;
        sVar18 = bottom_blob->cstep;
        pvVar19 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar27) {
            uVar24 = 0;
            do {
              *(float *)((long)pvVar19 + uVar24 * 4) = (float)(int)*(char *)((long)pvVar15 + uVar24)
              ;
              uVar24 = uVar24 + 1;
            } while (uVar27 != uVar24);
          }
          uVar21 = uVar21 + 1;
          pvVar19 = (void *)((long)pvVar19 + sVar3 * sVar4);
          pvVar15 = (void *)((long)pvVar15 + sVar18 * sVar5);
        } while (uVar21 != uVar17);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 4)) {
        iVar13 = cpu_support_x86_avx2();
        auVar10 = _DAT_00596ee0;
        auVar8 = _DAT_00596ec0;
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            uVar17 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            auVar32._8_8_ = 0x8000000000000000;
            auVar32._0_8_ = 0x8000000000000000;
            auVar31 = vpcmpeqd_avx(auVar31,auVar31);
            do {
              pauVar26 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar20 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar22 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar17 < 0x10) {
                uVar27 = 0;
              }
              else {
                iVar14 = 0xf;
                do {
                  auVar33 = vpsrld_avx(*pauVar26,0x10);
                  auVar34 = vpsrld_avx(pauVar26[1],0x10);
                  auVar33 = vpackusdw_avx(auVar33,auVar34);
                  auVar34 = vpsrld_avx(pauVar26[2],0x10);
                  auVar35 = vpsrld_avx(pauVar26[3],0x10);
                  auVar34 = vpackusdw_avx(auVar34,auVar35);
                  pauVar22[1] = auVar34;
                  *pauVar22 = auVar33;
                  pauVar26 = pauVar26 + 4;
                  pauVar22 = pauVar22 + 2;
                  iVar14 = iVar14 + 0x10;
                  uVar27 = uVar17 & 0xfffffff0;
                } while (iVar14 < (int)uVar17);
              }
              uVar25 = uVar27 | 7;
              while ((int)uVar25 < (int)uVar17) {
                auVar33 = vpsrld_avx(*pauVar26,0x10);
                auVar34 = vpsrld_avx(pauVar26[1],0x10);
                auVar33 = vpackusdw_avx(auVar33,auVar34);
                *pauVar22 = auVar33;
                pauVar26 = pauVar26 + 2;
                pauVar22 = pauVar22 + 1;
                uVar25 = uVar27 + 0xf;
                uVar27 = uVar27 + 8;
              }
              if ((int)uVar27 < (int)uVar17) {
                uVar21 = CONCAT44(0,~uVar27 + uVar17);
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar21;
                auVar35 = vpshufd_avx(auVar33,0x44);
                auVar33 = vorps_avx(auVar35,auVar32);
                auVar34 = vorps_avx(auVar35,auVar32);
                auVar35 = vorps_avx(auVar35,auVar32);
                uVar24 = 0;
                do {
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = uVar24;
                  auVar36 = vpshufd_avx(auVar36,0x44);
                  auVar38._16_16_ = auVar36;
                  auVar38._0_16_ = auVar36;
                  auVar6 = vorps_avx(auVar38,auVar8);
                  auVar38 = vorps_avx(auVar38,auVar10);
                  auVar37._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
                  auVar37._8_4_ = auVar38._24_4_;
                  auVar37._12_4_ = auVar38._28_4_ ^ 0x80000000;
                  auVar7 = vpcmpgtq_avx(auVar37,auVar33);
                  uVar9 = auVar38._0_8_;
                  auVar40._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar39._8_4_ = auVar38._8_4_;
                  auVar40._8_4_ = auVar39._8_4_;
                  uVar27 = auVar38._12_4_;
                  auVar40._12_4_ = uVar27 ^ 0x80000000;
                  auVar36 = vpcmpgtq_avx(auVar40,auVar34);
                  auVar36 = vpackssdw_avx(auVar36,auVar7);
                  auVar42._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
                  auVar42._8_4_ = auVar6._24_4_;
                  auVar42._12_4_ = auVar6._28_4_ ^ 0x80000000;
                  auVar40 = vpcmpgtq_avx(auVar42,auVar33);
                  auVar45._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar44._8_4_ = auVar6._8_4_;
                  auVar45._8_4_ = auVar44._8_4_;
                  auVar45._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar37 = vpcmpgtq_avx(auVar45,auVar35);
                  auVar37 = vpackssdw_avx(auVar37,auVar40);
                  auVar36 = vpackssdw_avx(auVar37 ^ auVar31,auVar36 ^ auVar31);
                  auVar37 = vpmovsxwd_avx(auVar36);
                  auVar42 = vpunpckhwd_avx(auVar36,auVar36);
                  auVar41._16_16_ = auVar42;
                  auVar41._0_16_ = auVar37;
                  auVar38 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(*pauVar26 + uVar24 * 4));
                  if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2) = auVar38._2_2_;
                  }
                  auVar44._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar44._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar36 = vpcmpgtq_avx(auVar44,auVar35);
                  auVar36 = vpackssdw_avx(auVar36,auVar36);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 2) = auVar38._6_2_;
                  }
                  auVar36 = vpackssdw_avx(auVar40,auVar40);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 4) = auVar38._10_2_;
                  }
                  auVar36 = vpackssdw_avx(auVar40,auVar40);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 6) = auVar38._14_2_;
                  }
                  auVar43._8_4_ = auVar39._8_4_;
                  auVar43._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar43._12_4_ = uVar27 ^ 0x80000000;
                  auVar36 = vpcmpgtq_avx(auVar43,auVar34);
                  auVar36 = vpackssdw_avx(auVar36,auVar36);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 8) = auVar38._18_2_;
                  }
                  auVar39._0_8_ = uVar9 ^ 0x8000000000000000;
                  auVar39._12_4_ = uVar27 ^ 0x80000000;
                  auVar36 = vpcmpgtq_avx(auVar39,auVar34);
                  auVar36 = vpackssdw_avx(auVar36,auVar36);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 10) = auVar38._22_2_;
                  }
                  auVar36 = vpackssdw_avx(auVar7,auVar7);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 0xc) = auVar38._26_2_;
                  }
                  auVar36 = vpackssdw_avx(auVar7,auVar7);
                  auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
                  if ((auVar36 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar22 + uVar24 * 2 + 0xe) = auVar38._30_2_;
                  }
                  uVar24 = uVar24 + 8;
                } while ((uVar21 + 8 & 0xfffffffffffffff8) != uVar24);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar13);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar13 = 0;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 4) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1)) {
        iVar14 = cpu_support_x86_avx2();
        if (iVar14 == 0) {
          iVar14 = bottom_blob->c;
          if (0 < (long)iVar14) {
            uVar17 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            auVar31 = ZEXT816(0) << 0x40;
            iVar13 = 0;
            do {
              pauVar26 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar20 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar22 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar17 < 8) {
                uVar27 = 0;
              }
              else {
                iVar23 = 7;
                do {
                  auVar33 = vpunpcklwd_avx(auVar31,*pauVar26);
                  auVar32 = vpunpckhwd_avx(auVar31,*pauVar26);
                  pauVar22[1] = auVar32;
                  *pauVar22 = auVar33;
                  pauVar26 = pauVar26 + 1;
                  pauVar22 = pauVar22 + 2;
                  iVar23 = iVar23 + 8;
                  uVar27 = uVar17 & 0xfffffff8;
                } while (iVar23 < (int)uVar17);
              }
              uVar25 = uVar27 | 3;
              while ((int)uVar25 < (int)uVar17) {
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)*pauVar26;
                auVar32 = vpunpcklwd_avx(auVar31,auVar34);
                *pauVar22 = auVar32;
                pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
                pauVar22 = pauVar22 + 1;
                uVar25 = uVar27 + 7;
                uVar27 = uVar27 + 4;
              }
              if (uVar17 - uVar27 != 0 && (int)uVar27 <= (int)uVar17) {
                lVar28 = 0;
                do {
                  *(uint *)(*pauVar22 + lVar28 * 4) =
                       (uint)*(ushort *)(*pauVar26 + lVar28 * 2) << 0x10;
                  lVar28 = lVar28 + 1;
                } while (uVar17 - uVar27 != (int)lVar28);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar14);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}